

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

bool listdir(char *dirname,bool rel,char *ext,vector<char_*> *files)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  DIR *__dirp;
  dirent64 *pdVar4;
  ulong l;
  char *pcVar5;
  int iVar6;
  string pathname;
  stringformatter local_148;
  size_t local_140;
  char local_138 [264];
  
  if (ext == (char *)0x0) {
    iVar6 = 0;
  }
  else {
    sVar3 = strlen(ext);
    iVar6 = (int)sVar3 + 1;
  }
  pcVar5 = "%s";
  if (rel) {
    pcVar5 = "./%s";
  }
  local_148.buf = local_138;
  stringformatter::operator()(&local_148,pcVar5,dirname);
  __dirp = opendir(local_138);
  if (__dirp != (DIR *)0x0) {
    local_140 = (size_t)(iVar6 + -1);
LAB_00153539:
    pdVar4 = readdir64(__dirp);
    if (pdVar4 != (dirent64 *)0x0) {
      pcVar5 = pdVar4->d_name;
      if (ext != (char *)0x0) goto code_r0x00153552;
      local_148.buf = newstring(pcVar5);
      goto LAB_00153598;
    }
    closedir(__dirp);
  }
  return __dirp != (DIR *)0x0;
code_r0x00153552:
  sVar3 = strlen(pcVar5);
  uVar1 = (int)sVar3 - iVar6;
  if ((uVar1 != 0 && iVar6 <= (int)sVar3) && (l = (ulong)uVar1, pcVar5[l] == '.')) {
    iVar2 = strncmp(pcVar5 + l + 1,ext,local_140);
    if (iVar2 == 0) {
      local_148.buf = newstring(pcVar5,l);
LAB_00153598:
      vector<char_*>::add(files,&local_148.buf);
    }
  }
  goto LAB_00153539;
}

Assistant:

bool listdir(const char *dirname, bool rel, const char *ext, vector<char *> &files)
{
    int extsize = ext ? (int)strlen(ext)+1 : 0;
    #ifdef WIN32
    defformatstring(pathname)(rel ? ".\\%s\\*.%s" : "%s\\*.%s", dirname, ext ? ext : "*");
    WIN32_FIND_DATA FindFileData;
    HANDLE Find = FindFirstFile(pathname, &FindFileData);
    if(Find != INVALID_HANDLE_VALUE)
    {
        do {
            if(!ext) files.add(newstring(FindFileData.cFileName));
            else
            {
                int namelength = (int)strlen(FindFileData.cFileName) - extsize;
                if(namelength > 0 && FindFileData.cFileName[namelength] == '.' && strncmp(FindFileData.cFileName+namelength+1, ext, extsize-1)==0)
                    files.add(newstring(FindFileData.cFileName, namelength));
            }
        } while(FindNextFile(Find, &FindFileData));
        FindClose(Find);
        return true;
    }
    #else
    defformatstring(pathname)(rel ? "./%s" : "%s", dirname);
    DIR *d = opendir(pathname);
    if(d)
    {
        struct dirent *de;
        while((de = readdir(d)) != NULL)
        {
            if(!ext) files.add(newstring(de->d_name));
            else
            {
                int namelength = (int)strlen(de->d_name) - extsize;
                if(namelength > 0 && de->d_name[namelength] == '.' && strncmp(de->d_name+namelength+1, ext, extsize-1)==0)
                    files.add(newstring(de->d_name, namelength));
            }
        }
        closedir(d);
        return true;
    }
    #endif
    else return false;
}